

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPropertyPattern
          (UnicodeSet *this,UnicodeString *pattern,ParsePosition *ppos,UErrorCode *ec)

{
  bool bVar1;
  UBool UVar2;
  char16_t cVar3;
  int iVar4;
  int32_t iVar5;
  uint uVar6;
  int32_t iVar7;
  bool bVar8;
  bool bVar9;
  UnicodeString local_118;
  undefined1 local_c8 [8];
  UnicodeString valueName;
  UnicodeString propName;
  uint local_40;
  int32_t equals;
  int32_t close;
  uint uStack_34;
  UChar c;
  UBool invert;
  UBool isName;
  UBool posix;
  UErrorCode *pUStack_30;
  int32_t pos;
  UErrorCode *ec_local;
  ParsePosition *ppos_local;
  UnicodeString *pattern_local;
  UnicodeSet *this_local;
  
  pUStack_30 = ec;
  ec_local = (UErrorCode *)ppos;
  ppos_local = (ParsePosition *)pattern;
  pattern_local = (UnicodeString *)this;
  uStack_34 = ParsePosition::getIndex(ppos);
  bVar1 = false;
  bVar9 = false;
  bVar8 = false;
  UVar2 = ::U_FAILURE(*pUStack_30);
  if (UVar2 != '\0') {
    return this;
  }
  iVar4 = uStack_34 + 5;
  iVar5 = UnicodeString::length((UnicodeString *)ppos_local);
  if (iVar5 < iVar4) {
    *pUStack_30 = U_ILLEGAL_ARGUMENT_ERROR;
    return this;
  }
  UVar2 = anon_unknown_0::isPOSIXOpen((UnicodeString *)ppos_local,uStack_34);
  this_local = this;
  if (UVar2 == '\0') {
    UVar2 = anon_unknown_0::isPerlOpen((UnicodeString *)ppos_local,uStack_34);
    if ((UVar2 == '\0') &&
       (UVar2 = anon_unknown_0::isNameOpen((UnicodeString *)ppos_local,uStack_34), UVar2 == '\0')) {
      *pUStack_30 = U_ILLEGAL_ARGUMENT_ERROR;
      return this;
    }
    cVar3 = UnicodeString::charAt((UnicodeString *)ppos_local,uStack_34 + 1);
    bVar8 = cVar3 == L'P';
    bVar9 = cVar3 == L'N';
    uStack_34 = uStack_34 + 2;
    iVar5 = ICU_Utility::skipWhitespace
                      ((UnicodeString *)ppos_local,(int32_t *)&stack0xffffffffffffffcc,'\0');
    uStack_34 = iVar5;
    iVar7 = UnicodeString::length((UnicodeString *)ppos_local);
    iVar4 = uStack_34;
    if (iVar5 != iVar7) {
      uStack_34 = uStack_34 + 1;
      cVar3 = UnicodeString::charAt((UnicodeString *)ppos_local,iVar4);
      if (cVar3 == L'{') goto LAB_003c10ad;
    }
    *pUStack_30 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    bVar1 = true;
    uStack_34 = uStack_34 + 2;
    uVar6 = ICU_Utility::skipWhitespace
                      ((UnicodeString *)ppos_local,(int32_t *)&stack0xffffffffffffffcc,'\0');
    uStack_34 = uVar6;
    iVar5 = UnicodeString::length((UnicodeString *)ppos_local);
    if (((int)uVar6 < iVar5) &&
       (cVar3 = UnicodeString::charAt((UnicodeString *)ppos_local,uStack_34), cVar3 == L'^')) {
      uStack_34 = uStack_34 + 1;
      bVar8 = true;
    }
LAB_003c10ad:
    if (bVar1) {
      local_40 = UnicodeString::indexOf((UnicodeString *)ppos_local,L":]",2,uStack_34);
    }
    else {
      local_40 = UnicodeString::indexOf((UnicodeString *)ppos_local,L'}',uStack_34);
    }
    if ((int)local_40 < 0) {
      *pUStack_30 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      uVar6 = UnicodeString::indexOf((UnicodeString *)ppos_local,L'=',uStack_34);
      UnicodeString::UnicodeString((UnicodeString *)((long)&valueName.fUnion + 0x30));
      UnicodeString::UnicodeString((UnicodeString *)local_c8);
      if ((((int)uVar6 < 0) || ((int)local_40 <= (int)uVar6)) || (bVar9)) {
        (*(ppos_local->super_UObject)._vptr_UObject[3])(ppos_local,(ulong)uStack_34,(ulong)local_40)
        ;
        if (bVar9) {
          UnicodeString::operator=
                    ((UnicodeString *)local_c8,(UnicodeString *)((long)&valueName.fUnion + 0x30));
          UnicodeString::UnicodeString(&local_118,"na",2,kInvariant);
          UnicodeString::operator=((UnicodeString *)((long)&valueName.fUnion + 0x30),&local_118);
          UnicodeString::~UnicodeString(&local_118);
        }
      }
      else {
        (*(ppos_local->super_UObject)._vptr_UObject[3])
                  (ppos_local,(ulong)uStack_34,(ulong)uVar6,
                   (undefined1 *)((long)&valueName.fUnion + 0x30));
        (*(ppos_local->super_UObject)._vptr_UObject[3])
                  (ppos_local,(ulong)(uVar6 + 1),(ulong)local_40,local_c8);
      }
      applyPropertyAlias(this,(UnicodeString *)((long)&valueName.fUnion + 0x30),
                         (UnicodeString *)local_c8,pUStack_30);
      UVar2 = ::U_SUCCESS(*pUStack_30);
      if (UVar2 != '\0') {
        if (bVar8) {
          complement(this);
        }
        ParsePosition::setIndex((ParsePosition *)ec_local,(local_40 - !bVar1) + 2);
      }
      UnicodeString::~UnicodeString((UnicodeString *)local_c8);
      UnicodeString::~UnicodeString((UnicodeString *)((long)&valueName.fUnion + 0x30));
    }
  }
  return this_local;
}

Assistant:

UnicodeSet& UnicodeSet::applyPropertyPattern(const UnicodeString& pattern,
                                             ParsePosition& ppos,
                                             UErrorCode &ec) {
    int32_t pos = ppos.getIndex();

    UBool posix = FALSE; // true for [:pat:], false for \p{pat} \P{pat} \N{pat}
    UBool isName = FALSE; // true for \N{pat}, o/w false
    UBool invert = FALSE;

    if (U_FAILURE(ec)) return *this;

    // Minimum length is 5 characters, e.g. \p{L}
    if ((pos+5) > pattern.length()) {
        FAIL(ec);
    }

    // On entry, ppos should point to one of the following locations:
    // Look for an opening [:, [:^, \p, or \P
    if (isPOSIXOpen(pattern, pos)) {
        posix = TRUE;
        pos += 2;
        pos = ICU_Utility::skipWhitespace(pattern, pos);
        if (pos < pattern.length() && pattern.charAt(pos) == COMPLEMENT) {
            ++pos;
            invert = TRUE;
        }
    } else if (isPerlOpen(pattern, pos) || isNameOpen(pattern, pos)) {
        UChar c = pattern.charAt(pos+1);
        invert = (c == UPPER_P);
        isName = (c == UPPER_N);
        pos += 2;
        pos = ICU_Utility::skipWhitespace(pattern, pos);
        if (pos == pattern.length() || pattern.charAt(pos++) != OPEN_BRACE) {
            // Syntax error; "\p" or "\P" not followed by "{"
            FAIL(ec);
        }
    } else {
        // Open delimiter not seen
        FAIL(ec);
    }

    // Look for the matching close delimiter, either :] or }
    int32_t close;
    if (posix) {
      close = pattern.indexOf(POSIX_CLOSE, 2, pos);
    } else {
      close = pattern.indexOf(CLOSE_BRACE, pos);
    }
    if (close < 0) {
        // Syntax error; close delimiter missing
        FAIL(ec);
    }

    // Look for an '=' sign.  If this is present, we will parse a
    // medium \p{gc=Cf} or long \p{GeneralCategory=Format}
    // pattern.
    int32_t equals = pattern.indexOf(EQUALS, pos);
    UnicodeString propName, valueName;
    if (equals >= 0 && equals < close && !isName) {
        // Equals seen; parse medium/long pattern
        pattern.extractBetween(pos, equals, propName);
        pattern.extractBetween(equals+1, close, valueName);
    }

    else {
        // Handle case where no '=' is seen, and \N{}
        pattern.extractBetween(pos, close, propName);
            
        // Handle \N{name}
        if (isName) {
            // This is a little inefficient since it means we have to
            // parse NAME_PROP back to UCHAR_NAME even though we already
            // know it's UCHAR_NAME.  If we refactor the API to
            // support args of (UProperty, char*) then we can remove
            // NAME_PROP and make this a little more efficient.
            valueName = propName;
            propName = UnicodeString(NAME_PROP, NAME_PROP_LENGTH, US_INV);
        }
    }

    applyPropertyAlias(propName, valueName, ec);

    if (U_SUCCESS(ec)) {
        if (invert) {
            complement();
        }
            
        // Move to the limit position after the close delimiter if the
        // parse succeeded.
        ppos.setIndex(close + (posix ? 2 : 1));
    }

    return *this;
}